

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Login.cpp
# Opt level: O2

void Handlers::Login_Request(EOClient *client,PacketReader *reader)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  World *this;
  pointer ppCVar4;
  Character *this_00;
  size_type sVar5;
  size_type sVar6;
  bool bVar7;
  LoginReply num;
  int iVar8;
  int iVar9;
  mapped_type *pmVar10;
  Player *pPVar11;
  pointer ppCVar12;
  allocator local_101;
  PacketBuilder reply;
  key_type local_d0;
  string username;
  secure_string password;
  key_type local_70;
  string local_50;
  
  PacketReader::GetBreakString_abi_cxx11_(&username,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_((string *)&reply,reader,0xff);
  util::secure_string::secure_string(&password,(string *)&reply);
  std::__cxx11::string::~string((string *)&reply);
  sVar5 = username._M_string_length;
  p_Var1 = (client->super_Client).server[1].clients.
           super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  std::__cxx11::string::string((string *)&reply,"AccountMaxLength",(allocator *)&local_70);
  pmVar10 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&p_Var1[0x19]._M_prev,(key_type *)&reply);
  iVar8 = util::variant::GetInt(pmVar10);
  sVar6 = password.str_._M_string_length;
  if ((ulong)(long)iVar8 < sVar5) {
    std::__cxx11::string::~string((string *)&reply);
  }
  else {
    p_Var1 = (client->super_Client).server[1].clients.
             super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    std::__cxx11::string::string((string *)&local_d0,"PasswordMaxLength",&local_101);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&p_Var1[0x19]._M_prev,&local_d0);
    iVar8 = util::variant::GetInt(pmVar10);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&reply);
    if (sVar6 <= (ulong)(long)iVar8) {
      util::lowercase((string *)&reply,&username);
      std::__cxx11::string::operator=((string *)&username,(string *)&reply);
      std::__cxx11::string::~string((string *)&reply);
      p_Var1 = (client->super_Client).server[1].clients.
               super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
               super__List_node_base._M_next;
      std::__cxx11::string::string((string *)&reply,"SeoseCompat",(allocator *)&local_d0);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var1[0x19]._M_prev,(key_type *)&reply);
      bVar7 = util::variant::GetBool(pmVar10);
      std::__cxx11::string::~string((string *)&reply);
      if (bVar7) {
        p_Var1 = (client->super_Client).server[1].clients.
                 super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        std::__cxx11::string::string((string *)&local_70,"SeoseCompatKey",&local_101);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&p_Var1[0x19]._M_prev,&local_70);
        util::variant::GetString_abi_cxx11_(&local_d0,pmVar10);
        seose_str_hash((string *)&reply,&password.str_,&local_d0);
        util::secure_string::operator=(&password,(string *)&reply);
        std::__cxx11::string::~string((string *)&reply);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_70);
      }
      iVar8 = World::CheckBan((World *)(client->super_Client).server[1].clients.
                                       super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl
                                       ._M_node.super__List_node_base._M_next,&username,
                              (IPAddress *)0x0,(int *)0x0);
      if (iVar8 == -1) {
        p_Var1 = (client->super_Client).server[1].clients.
                 super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        std::__cxx11::string::string((string *)&reply,"AccountMinLength",(allocator *)&local_d0);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&p_Var1[0x19]._M_prev,(key_type *)&reply);
        iVar8 = util::variant::GetInt(pmVar10);
        std::__cxx11::string::~string((string *)&reply);
        if (username._M_string_length < (ulong)(long)iVar8) {
          PacketBuilder::PacketBuilder(&reply,PACKET_LOGIN,PACKET_REPLY,2);
          PacketBuilder::AddShort(&reply,1);
          EOClient::Send(client,&reply);
        }
        else {
          p_Var1 = (client->super_Client).server[1].clients.
                   super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                   super__List_node_base._M_next;
          std::__cxx11::string::string((string *)&reply,"PasswordMinLength",(allocator *)&local_d0);
          pmVar10 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&p_Var1[0x19]._M_prev,(key_type *)&reply);
          iVar8 = util::variant::GetInt(pmVar10);
          std::__cxx11::string::~string((string *)&reply);
          if (password.str_._M_string_length < (ulong)(long)iVar8) {
            PacketBuilder::PacketBuilder(&reply,PACKET_LOGIN,PACKET_REPLY,2);
            PacketBuilder::AddShort(&reply,2);
            EOClient::Send(client,&reply);
          }
          else {
            p_Var1 = (client->super_Client).server[1].clients.
                     super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                     super__List_node_base._M_next;
            p_Var2 = p_Var1[0x46]._M_prev;
            p_Var3 = p_Var1[0x46]._M_next;
            std::__cxx11::string::string((string *)&reply,"MaxPlayers",(allocator *)&local_d0);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&p_Var1[0x19]._M_prev,(key_type *)&reply);
            iVar8 = util::variant::GetInt(pmVar10);
            std::__cxx11::string::~string((string *)&reply);
            if ((ulong)((long)p_Var2 - (long)p_Var3 >> 3) < (ulong)(long)iVar8) {
              num = World::LoginCheck((World *)(client->super_Client).server[1].clients.
                                               super__List_base<Client_*,_std::allocator<Client_*>_>
                                               ._M_impl._M_node.super__List_node_base._M_next,
                                      &username,&password);
              if (num == LOGIN_OK) {
                this = (World *)(client->super_Client).server[1].clients.
                                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                                _M_node.super__List_node_base._M_next;
                std::__cxx11::string::string((string *)&local_50,(string *)&username);
                pPVar11 = World::Login(this,&local_50);
                client->player = pPVar11;
                std::__cxx11::string::~string((string *)&local_50);
                if (client->player == (Player *)0x0) {
                  PacketBuilder::PacketBuilder(&reply,PACKET_LOGIN,PACKET_REPLY,2);
                  PacketBuilder::AddShort(&reply,1);
                  EOClient::Send(client,&reply);
                }
                else {
                  client->player->id = client->id;
                  client->player->client = client;
                  client->state = LoggedIn;
                  PacketBuilder::PacketBuilder
                            (&reply,PACKET_LOGIN,PACKET_REPLY,
                             ((long)(client->player->characters).
                                    super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(client->player->characters).
                                    super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x22 + 5);
                  PacketBuilder::AddShort(&reply,3);
                  PacketBuilder::AddChar
                            (&reply,(uchar)((uint)(*(int *)&(client->player->characters).
                                                                                                                        
                                                  super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  *(int *)&(client->player->characters).
                                                                                                                      
                                                  super__Vector_base<Character_*,_std::allocator<Character_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
                  PacketBuilder::AddByte(&reply,'\x02');
                  PacketBuilder::AddByte(&reply,0xff);
                  ppCVar4 = (client->player->characters).
                            super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  for (ppCVar12 = (client->player->characters).
                                  super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start; ppCVar12 != ppCVar4;
                      ppCVar12 = ppCVar12 + 1) {
                    this_00 = *ppCVar12;
                    (*(this_00->super_Command_Source)._vptr_Command_Source[2])(&local_d0,this_00);
                    PacketBuilder::AddBreakString(&reply,&local_d0,0xff);
                    std::__cxx11::string::~string((string *)&local_d0);
                    PacketBuilder::AddInt(&reply,this_00->id);
                    PacketBuilder::AddChar(&reply,this_00->level);
                    PacketBuilder::AddChar(&reply,this_00->gender);
                    PacketBuilder::AddChar(&reply,this_00->hairstyle);
                    PacketBuilder::AddChar(&reply,this_00->haircolor);
                    PacketBuilder::AddChar(&reply,this_00->race);
                    PacketBuilder::AddChar(&reply,this_00->admin);
                    Character::AddPaperdollData(this_00,&reply,"BAHSW");
                    PacketBuilder::AddByte(&reply,0xff);
                  }
                  EOClient::Send(client,&reply);
                }
              }
              else {
                PacketBuilder::PacketBuilder(&reply,PACKET_LOGIN,PACKET_REPLY,2);
                PacketBuilder::AddShort(&reply,num);
                EOClient::Send(client,&reply);
                p_Var1 = (client->super_Client).server[1].clients.
                         super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                         super__List_node_base._M_next;
                std::__cxx11::string::string
                          ((string *)&local_d0,"MaxLoginAttempts",(allocator *)&local_70);
                pmVar10 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&p_Var1[0x19]._M_prev,&local_d0);
                iVar8 = util::variant::GetInt(pmVar10);
                std::__cxx11::string::~string((string *)&local_d0);
                if ((iVar8 != 0) &&
                   (iVar9 = client->login_attempts + 1, client->login_attempts = iVar9,
                   iVar8 <= iVar9)) {
                  Client::Close(&client->super_Client,false);
                }
              }
            }
            else {
              PacketBuilder::PacketBuilder(&reply,PACKET_LOGIN,PACKET_REPLY,2);
              PacketBuilder::AddShort(&reply,6);
              EOClient::Send(client,&reply);
              Client::Close(&client->super_Client,false);
            }
          }
        }
      }
      else {
        PacketBuilder::PacketBuilder(&reply,PACKET_F_INIT,PACKET_A_INIT,2);
        PacketBuilder::AddByte(&reply,'\x03');
        PacketBuilder::AddByte(&reply,'\x02');
        EOClient::Send(client,&reply);
        Client::Close(&client->super_Client,false);
      }
      PacketBuilder::~PacketBuilder(&reply);
    }
  }
  util::secure_string::~secure_string(&password);
  std::__cxx11::string::~string((string *)&username);
  return;
}

Assistant:

void Login_Request(EOClient *client, PacketReader &reader)
{
	std::string username = reader.GetBreakString();
	util::secure_string password(std::move(reader.GetBreakString()));

	if (username.length() > std::size_t(int(client->server()->world->config["AccountMaxLength"]))
	 || password.str().length() > std::size_t(int(client->server()->world->config["PasswordMaxLength"])))
	{
		return;
	}

	username = util::lowercase(username);

	if (client->server()->world->config["SeoseCompat"])
		password = std::move(seose_str_hash(password.str(), client->server()->world->config["SeoseCompatKey"]));

	if (client->server()->world->CheckBan(&username, 0, 0) != -1)
	{
		PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 2);
		reply.AddByte(INIT_BANNED);
		reply.AddByte(INIT_BAN_PERM);
		client->Send(reply);
		client->Close();
		return;
	}

	if (username.length() < std::size_t(int(client->server()->world->config["AccountMinLength"])))
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_WRONG_USER);
		client->Send(reply);
		return;
	}

	if (password.str().length() < std::size_t(int(client->server()->world->config["PasswordMinLength"])))
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_WRONG_USERPASS);
		client->Send(reply);
		return;
	}

	if (client->server()->world->characters.size() >= static_cast<std::size_t>(static_cast<int>(client->server()->world->config["MaxPlayers"])))
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_BUSY);
		client->Send(reply);
		client->Close();
		return;
	}

	LoginReply login_reply = client->server()->world->LoginCheck(username, std::move(password));

	if (login_reply != LOGIN_OK)
	{
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(login_reply);
		client->Send(reply);

		int max_login_attempts = int(client->server()->world->config["MaxLoginAttempts"]);

		if (max_login_attempts != 0 && ++client->login_attempts >= max_login_attempts)
		{
			client->Close();
		}

		return;
	}

	client->player = client->server()->world->Login(username);

	if (!client->player)
	{
		// Someone deleted the account between checking it and logging in
		PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 2);
		reply.AddShort(LOGIN_WRONG_USER);
		client->Send(reply);
		return;
	}

	client->player->id = client->id;
	client->player->client = client;
	client->state = EOClient::LoggedIn;

	PacketBuilder reply(PACKET_LOGIN, PACKET_REPLY, 5 + client->player->characters.size() * 34);
	reply.AddShort(LOGIN_OK);
	reply.AddChar(client->player->characters.size());
	reply.AddByte(2);
	reply.AddByte(255);
	UTIL_FOREACH(client->player->characters, character)
	{
		reply.AddBreakString(character->SourceName());
		reply.AddInt(character->id);
		reply.AddChar(character->level);
		reply.AddChar(character->gender);
		reply.AddChar(character->hairstyle);
		reply.AddChar(character->haircolor);
		reply.AddChar(character->race);
		reply.AddChar(character->admin);
		character->AddPaperdollData(reply, "BAHSW");

		reply.AddByte(255);
	}
	client->Send(reply);
}